

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testSpecDowngradefp16(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  Type *pTVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  TypeUnion this_00;
  Type *this_01;
  ConvolutionLayerParams *pCVar7;
  ValidPadding *this_02;
  WeightParams *pWVar8;
  Model *pMVar9;
  ostream *poVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  Result res;
  Model m1;
  Model mlmodel;
  undefined1 local_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  Model local_78;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_78);
  local_78.specificationversion_ = 5;
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_78.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_78.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_a0 + 0x10;
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a0);
  if ((pointer)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if (pTVar4->type_ == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  pAVar6 = (pFVar5->Type_).multiarraytype_;
  this = &pAVar6->shape_;
  iVar13 = (pAVar6->shape_).total_size_;
  if ((pAVar6->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar13 + 1);
  }
  iVar13 = (pAVar6->shape_).current_size_;
  iVar11 = iVar13 + 1;
  (pAVar6->shape_).current_size_ = iVar11;
  ((pAVar6->shape_).rep_)->elements[iVar13] = 3;
  iVar13 = (pAVar6->shape_).total_size_;
  if (iVar11 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar13 + 1);
  }
  iVar13 = (pAVar6->shape_).current_size_;
  iVar11 = iVar13 + 1;
  (pAVar6->shape_).current_size_ = iVar11;
  ((pAVar6->shape_).rep_)->elements[iVar13] = 100;
  iVar13 = (pAVar6->shape_).total_size_;
  if (iVar11 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar13 + 1);
  }
  iVar13 = (pAVar6->shape_).current_size_;
  (pAVar6->shape_).current_size_ = iVar13 + 1;
  ((pAVar6->shape_).rep_)->elements[iVar13] = 100;
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_78.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_78.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a0);
  if ((pointer)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if (pTVar4->type_ == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  if (local_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_78);
    local_78._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_78.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_78.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 100;
    pCVar7 = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(pCVar7);
    (this_01->layer_).convolution_ = pCVar7;
  }
  pCVar7 = (this_01->layer_).convolution_;
  pCVar7->outputchannels_ = 5;
  pCVar7->kernelchannels_ = 3;
  iVar13 = (pCVar7->kernelsize_).total_size_;
  if ((pCVar7->kernelsize_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar7->kernelsize_,iVar13 + 1);
  }
  iVar13 = (pCVar7->kernelsize_).current_size_;
  iVar11 = iVar13 + 1;
  (pCVar7->kernelsize_).current_size_ = iVar11;
  ((pCVar7->kernelsize_).rep_)->elements[iVar13] = 2;
  iVar13 = (pCVar7->kernelsize_).total_size_;
  if (iVar11 == iVar13) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar7->kernelsize_,iVar13 + 1);
  }
  iVar13 = (pCVar7->kernelsize_).current_size_;
  (pCVar7->kernelsize_).current_size_ = iVar13 + 1;
  ((pCVar7->kernelsize_).rep_)->elements[iVar13] = 5;
  pCVar7->hasbias_ = true;
  if (pCVar7->_oneof_case_[0] != 0x32) {
    CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(pCVar7);
    pCVar7->_oneof_case_[0] = 0x32;
    this_02 = (ValidPadding *)operator_new(0x20);
    CoreML::Specification::ValidPadding::ValidPadding(this_02);
    (pCVar7->ConvolutionPaddingType_).valid_ = this_02;
  }
  iVar13 = 0x96;
  do {
    if (pCVar7->weights_ == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      pCVar7->weights_ = pWVar8;
    }
    pWVar8 = pCVar7->weights_;
    local_a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct((ulong)local_a0,',');
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pWVar8->float16value_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (string *)local_a0);
    if ((pointer)local_a0._0_8_ != pcVar1) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  iVar13 = 5;
  do {
    if (pCVar7->bias_ == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      pCVar7->bias_ = pWVar8;
    }
    pWVar8 = pCVar7->bias_;
    local_a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct((ulong)local_a0,'\n');
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pWVar8->float16value_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (string *)local_a0);
    if ((pointer)local_a0._0_8_ != pcVar1) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  CoreML::validate<(MLModelType)500>((Result *)local_a0,&local_78);
  bVar2 = CoreML::Result::good((Result *)local_a0);
  if (bVar2) {
    CoreML::Model::Model(&local_48,&local_78);
    pMVar9 = CoreML::Model::getProto(&local_48);
    bVar2 = pMVar9->specificationversion_ != 2;
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1029);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2"
                 ,0x52);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    uVar12 = (uint)bVar2;
    CoreML::Model::~Model(&local_48);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1025);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    uVar12 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._8_8_ != &local_88) {
    operator_delete((void *)local_a0._8_8_,local_88._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_78);
  return uVar12;
}

Assistant:

int testSpecDowngradefp16() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    int output_channels = 5;
    int kernel_channels = 3;
    int kernel_height = 2;
    int kernel_width = 5;
    int nGroups = 1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);
    params->add_kernelsize(kernel_height);
    params->add_kernelsize(kernel_width);

    params->set_hasbias(true);

    (void)params->mutable_valid();

    int num_weights = output_channels * (kernel_channels / nGroups) * kernel_height * kernel_width;
    for (int i = 0; i < num_weights; i++) {
        params->mutable_weights()->set_float16value(std::string(num_weights*2, 'a'));
    }

    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->set_float16value(std::string(output_channels*2, 'b'));
    }

    // Not specifying the right number of weights should be invalid
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2);

    return 0;

}